

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStreamPrivate::reset(QTextStreamPrivate *this)

{
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff48;
  OpenModeFlag in_stack_ffffffffffffff4c;
  Encoding encoding;
  Params *in_stack_ffffffffffffff50;
  QStringDecoder *this_00;
  QFlagsStorage<QStringConverter::Flag> in_stack_ffffffffffffff5c;
  QFlagsStorage<QStringConverter::Flag> flags;
  undefined4 local_7c;
  QStringDecoder local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Params::reset(in_stack_ffffffffffffff50);
  *in_RDI = 0;
  *(undefined1 *)(in_RDI + 0x29) = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff4c);
  *(undefined4 *)(in_RDI + 3) = local_7c;
  in_RDI[0x1f] = 0;
  in_RDI[0x21] = 0;
  in_RDI[0x28] = 0;
  *(undefined1 *)((long)in_RDI + 0x14a) = 0;
  *(undefined1 *)((long)in_RDI + 0x14b) = 0;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  encoding = *(Encoding *)((long)in_RDI + 0x1c);
  QFlags<QStringConverter::Flag>::QFlags
            ((QFlags<QStringConverter::Flag> *)in_stack_ffffffffffffff50,encoding);
  this_00 = &local_40;
  QStringDecoder::QStringDecoder(this_00,encoding,(Flags)in_stack_ffffffffffffff5c.i);
  QStringDecoder::operator=(this_00,(QStringDecoder *)CONCAT44(encoding,in_stack_ffffffffffffff48));
  QStringDecoder::~QStringDecoder((QStringDecoder *)0x133d25);
  flags.i = ((QFlagsStorage<QStringConverter::Flag> *)((long)in_RDI + 0x1c))->i;
  QFlags<QStringConverter::Flag>::QFlags((QFlags<QStringConverter::Flag> *)this_00,encoding);
  QStringEncoder::QStringEncoder((QStringEncoder *)this_00,encoding,(Flags)flags.i);
  QStringEncoder::operator=
            ((QStringEncoder *)this_00,
             (QStringEncoder *)CONCAT44(encoding,in_stack_ffffffffffffff48));
  QStringEncoder::~QStringEncoder((QStringEncoder *)0x133d73);
  *(undefined1 *)((long)in_RDI + 0x149) = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::reset()
{
    params.reset();

    device = nullptr;
    deleteDevice = false;
    string = nullptr;
    stringOffset = 0;
    stringOpenMode = QTextStream::NotOpen;

    readBufferOffset = 0;
    readBufferStartDevicePos = 0;
    lastTokenSize = 0;

    hasWrittenData = false;
    generateBOM = false;
    encoding = QStringConverter::Utf8;
    toUtf16 = QStringDecoder(encoding);
    fromUtf16 = QStringEncoder(encoding);
    autoDetectUnicode = true;
}